

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

EnumValueOptions * __thiscall
google::protobuf::EnumValueDescriptorProto::_internal_mutable_options
          (EnumValueDescriptorProto *this)

{
  ulong uVar1;
  EnumValueOptions *pEVar2;
  Arena *arena;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
  if (this->options_ != (EnumValueOptions *)0x0) {
    return this->options_;
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pEVar2 = Arena::CreateMaybeMessage<google::protobuf::EnumValueOptions>(arena);
  this->options_ = pEVar2;
  return pEVar2;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::EnumValueOptions* EnumValueDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000002u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<::PROTOBUF_NAMESPACE_ID::EnumValueOptions>(GetArenaForAllocation());
    options_ = p;
  }
  return options_;
}